

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sockets.cpp
# Opt level: O1

uint32_t __thiscall TcpSocket::Connect(TcpSocket *this)

{
  int iVar1;
  uint uVar2;
  runtime_error *this_00;
  socklen_t len;
  sockaddr_storage source;
  stringstream stream;
  socklen_t local_23c;
  string local_238;
  sockaddr local_218 [8];
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  local_23c = 0x80;
  iVar1 = getsockname((this->super_Socket).m_Socket,local_218,&local_23c);
  if (iVar1 == 0) {
    if (local_218[0].sa_family == 10) {
      uVar2 = 0xffffffff;
    }
    else if (local_218[0].sa_family == 2) {
      uVar2 = (uint)local_218[0].sa_data._2_4_ >> 0x18 |
              (local_218[0].sa_data._2_4_ & 0xff0000) >> 8 |
              (local_218[0].sa_data._2_4_ & 0xff00) << 8 | local_218[0].sa_data._2_4_ << 0x18;
    }
    else {
      uVar2 = 0;
    }
    return uVar2;
  }
  std::__cxx11::stringstream::stringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"Read local tcp/ip address failed",0x20);
  std::__cxx11::stringbuf::str();
  Logger::Log(3,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Read local tcp/ip address failed");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint32_t TcpSocket::Connect() const
{
    struct sockaddr_storage source;
    socklen_t len = sizeof(source);

    if (getsockname(m_Socket, reinterpret_cast<sockaddr*>(&source), &len)) {
        LOG_ERROR("Read local tcp/ip address failed");
        throw std::runtime_error("Read local tcp/ip address failed");
    }

    switch (source.ss_family) {
    case AF_INET:
        return ntohl(reinterpret_cast<sockaddr_in*>(&source)->sin_addr.s_addr);

    case AF_INET6:
        return 0xffffffff;

    default:
        return 0;
    }
}